

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

bool __thiscall cfd::core::KeyFormatData::IsFindVersion(KeyFormatData *this,uint32_t version)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  initializer_list<const_cfd::core::ExtkeyVersionPair_*> __l;
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  cache_list;
  allocator_type local_51;
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  local_50;
  ExtkeyVersionPair *local_38;
  ExtkeyVersionPair *local_30;
  ExtkeyVersionPair *local_28;
  
  local_38 = &this->bip32_;
  local_30 = &this->bip49_;
  local_28 = &this->bip84_;
  __l._M_len = 3;
  __l._M_array = &local_38;
  ::std::
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::vector(&local_50,__l,&local_51);
  lVar3 = 0;
  do {
    uVar1 = *(uint *)((long)&kFormatTypeList + lVar3);
    if (((this->has_format_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
         ((ulong)uVar1 & 0x3f) & 1) != 0) {
      bVar2 = true;
      if ((local_50.
           super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar1]->pubkey_version == version) ||
         (local_50.
          super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar1]->privkey_version == version))
      goto LAB_003544e5;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  bVar4 = false;
  bVar2 = false;
  if (local_50.
      super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_003544e5:
    bVar4 = bVar2;
    operator_delete(local_50.
                    super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool KeyFormatData::IsFindVersion(uint32_t version) const {
  std::vector<const ExtkeyVersionPair *> cache_list = {
      &bip32_, &bip49_, &bip84_};
  for (const auto &type : kFormatTypeList) {
    if (has_format_[type]) {
      if ((cache_list[type]->pubkey_version == version) ||
          (cache_list[type]->privkey_version == version)) {
        return true;
      }
    }
  }
  return false;
}